

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O0

enum_type __thiscall
stored_enum<setup::(anonymous_namespace)::stored_install_verbosity>::get
          (stored_enum<setup::(anonymous_namespace)::stored_install_verbosity> *this)

{
  logger *this_00;
  logger *i;
  ulong *in_RDI;
  char (*in_stack_fffffffffffffe38) [10];
  logger *in_stack_fffffffffffffe40;
  logger *in_stack_ffffffffffffff70;
  enum_type local_4;
  
  if (*in_RDI < 3) {
    local_4 = *(enum_type *)
               (setup::(anonymous_namespace)::stored_install_verbosity::values + *in_RDI * 4);
  }
  else {
    logger::logger(in_stack_fffffffffffffe40,(log_level)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    logger::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    this_00 = logger::operator<<(in_stack_fffffffffffffe40,(char **)in_stack_fffffffffffffe38);
    i = logger::operator<<(this_00,in_stack_fffffffffffffe38);
    logger::operator<<(this_00,(unsigned_long *)i);
    logger::~logger(in_stack_ffffffffffffff70);
    local_4 = NormalInstallMode;
  }
  return local_4;
}

Assistant:

enum_type get() {
		
		if(value < size) {
			return Mapping::values[value];
		}
		
		log_warning << "Unexpected " << enum_names<enum_type>::name << " value: " << value;
		
		return Mapping::default_value;
	}